

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O3

void * __thiscall controller::findHandle(controller *this,string *key)

{
  int iVar1;
  int *piVar2;
  undefined1 **ppuVar3;
  char *pcVar4;
  long lVar5;
  string tmp;
  robj okey;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  undefined4 local_38 [2];
  string *local_30;
  
  local_38[0] = 0;
  local_30 = key;
  piVar2 = (int *)dic::dictFetchValue(&this->dcdb,this->dictidx,local_38);
  if (piVar2 == (int *)0x0) {
    ppuVar3 = (undefined1 **)(undefined1 *)0x0;
  }
  else if (*piVar2 == 2) {
    local_50 = 0;
    local_48[0] = 0;
    pcVar4 = *(char **)(piVar2 + 2);
    local_58 = local_48;
    while (iVar1 = std::__cxx11::string::compare(pcVar4), iVar1 != 0) {
      pcVar4 = pcVar4 + 0x20;
      std::__cxx11::string::_M_append((char *)&local_58,**(ulong **)(piVar2 + 2));
    }
    ppuVar3 = &local_58;
    if (local_58 != local_48) {
      operator_delete(local_58);
      ppuVar3 = &local_58;
    }
  }
  else if (*piVar2 == 0) {
    ppuVar3 = (undefined1 **)*(undefined1 **)(piVar2 + 2);
  }
  else {
    lVar5 = *(long *)(piVar2 + 2);
    local_50 = 0;
    local_48[0] = 0;
    ppuVar3 = &local_58;
    local_58 = local_48;
    if (lVar5 != 0) {
      do {
        std::__cxx11::string::_M_append((char *)&local_58,**(ulong **)(lVar5 + 0x10));
        lVar5 = *(long *)(lVar5 + 8);
      } while (lVar5 != 0);
      ppuVar3 = &local_58;
      if (local_58 != local_48) {
        operator_delete(local_58);
        ppuVar3 = &local_58;
      }
    }
  }
  return (undefined1 *)ppuVar3;
}

Assistant:

void * controller::findHandle(std::string key){
    robj okey;
    okey.objtype=_string;
    okey.ptr=&key;
    void *fetch=NULL;
    void *result=NULL;
    fetch=controller::dcdb.dictFetchValue(controller::dictidx,&okey);
    if(fetch==NULL)
        return fetch;
    else if(((robj *)fetch)->objtype==_string)
        return ((robj *)fetch)->ptr;//consider to return string 
    else if (((robj *)fetch)->objtype==_set){
        std::string tmp;
        std::string *p=((std::string *)(((robj *)fetch)->ptr));
        while(*p++!="\0"){
            tmp+=*((std::string *)(((robj *)fetch)->ptr));
        }
        result=&tmp;
        return result;
    }
    else if(((robj *)fetch)->objtype==_list){
        listNode *p=(listNode *)(((robj *)fetch)->ptr);
        std::string tmp;
        while(p!=NULL){
            tmp+=*((std::string *)p->value);
            p=p->next;  
        }
        result=&tmp;
        return result;
    }
}